

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O3

void __thiscall DStrifeStatusBar::DrawFullScreenStuff(DStrifeStatusBar *this)

{
  FImageCollection *this_00;
  uint uVar1;
  player_t *ppVar2;
  APlayerPawn *pAVar3;
  DFrameBuffer *pDVar4;
  undefined4 uVar5;
  FTexture *pFVar6;
  AInventory *pAVar7;
  ulong uVar8;
  AInventory *pAVar9;
  int iVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  AAmmo *ammo2;
  AAmmo *ammo1;
  int ammocount2;
  int ammocount1;
  AAmmo *local_48;
  AAmmo *local_40;
  int local_38;
  int local_34;
  
  DBaseStatusBar::DrINumberOuter
            (&this->super_DBaseStatusBar,((this->super_DBaseStatusBar).CPlayer)->health,4,-10,false,
             7);
  pDVar4 = screen;
  this_00 = &this->Images;
  pFVar6 = FImageCollection::operator[](this_00,0x1f);
  DCanvas::DrawTexture((DCanvas *)pDVar4,pFVar6,14.0,-17.0,0x400013a6,0,0x4000139e,1,0);
  pAVar7 = AActor::FindInventory
                     (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                      (PClassActor *)ABasicArmor::RegistrationInfo.MyClass,false);
  if ((pAVar7 != (AInventory *)0x0) && (pAVar7->Amount != 0)) {
    pFVar6 = (FTexture *)0x0;
    DBaseStatusBar::DrINumberOuter(&this->super_DBaseStatusBar,pAVar7->Amount,0x23,-10,false,7);
    uVar8 = (ulong)(pAVar7->Icon).texnum;
    if (uVar8 < TexMan.Textures.Count) {
      pFVar6 = TexMan.Textures.Array[TexMan.Translation.Array[uVar8]].Texture;
    }
    DCanvas::DrawTexture((DCanvas *)screen,pFVar6,45.0,-17.0,0x400013a6,0,0x4000139e,1,0);
  }
  DBaseStatusBar::GetCurrentAmmo
            (&this->super_DBaseStatusBar,&local_40,&local_48,&local_34,&local_38);
  if (local_40 != (AAmmo *)0x0) {
    pFVar6 = (FTexture *)0x0;
    DBaseStatusBar::DrINumberOuter
              (&this->super_DBaseStatusBar,(local_40->super_AInventory).Amount,-0x17,-10,false,7);
    uVar8 = (ulong)(local_40->super_AInventory).Icon.texnum;
    if (uVar8 < TexMan.Textures.Count) {
      pFVar6 = TexMan.Textures.Array[TexMan.Translation.Array[uVar8]].Texture;
    }
    DCanvas::DrawTexture((DCanvas *)screen,pFVar6,-14.0,-17.0,0x400013a6,0,0x4000139e,1,0);
    if ((local_48 != (AAmmo *)0x0) && (local_40 != local_48)) {
      pFVar6 = (FTexture *)0x0;
      DBaseStatusBar::DrINumberOuter
                (&this->super_DBaseStatusBar,(local_48->super_AInventory).Amount,-0x17,-0x30,false,7
                );
      uVar8 = (ulong)(local_48->super_AInventory).Icon.texnum;
      if (uVar8 < TexMan.Textures.Count) {
        pFVar6 = TexMan.Textures.Array[TexMan.Translation.Array[uVar8]].Texture;
      }
      DCanvas::DrawTexture((DCanvas *)screen,pFVar6,-14.0,-55.0,0x400013a6,0,0x4000139e,1,0);
    }
  }
  if (deathmatch.Value != 0) {
    DBaseStatusBar::DrBNumberOuterFont
              (&this->super_DBaseStatusBar,((this->super_DBaseStatusBar).CPlayer)->fragcount,-0x2c,1
               ,3);
  }
  ppVar2 = (this->super_DBaseStatusBar).CPlayer;
  if (ppVar2->inventorytics == 0) {
    pAVar3 = ppVar2->mo;
    pAVar7 = (pAVar3->InvSel).field_0.p;
    if (pAVar7 != (AInventory *)0x0) {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        if (0.0 < this->ItemFlash) {
          pFVar6 = FImageCollection::operator[](this_00,this->CursorImage);
          DCanvas::DrawTexture
                    ((DCanvas *)screen,pFVar6,-28.0,-15.0,0x400013a6,this->ItemFlash,0,0x4000139c,
                     (ulong)pFVar6->Width,0x4000139b,(uint)pFVar6->Height,0x4000138c,0);
          pAVar7 = (((this->super_DBaseStatusBar).CPlayer)->mo->InvSel).field_0.p;
        }
        DBaseStatusBar::DrINumberOuter(&this->super_DBaseStatusBar,pAVar7->Amount,-0x33,-10,false,7)
        ;
        pAVar7 = (((this->super_DBaseStatusBar).CPlayer)->mo->InvSel).field_0.p;
        uVar8 = (ulong)(pAVar7->Icon).texnum;
        if (uVar8 < TexMan.Textures.Count) {
          pFVar6 = TexMan.Textures.Array[TexMan.Translation.Array[uVar8]].Texture;
        }
        else {
          pFVar6 = (FTexture *)0x0;
        }
        uVar5 = 0xaa000000;
        if (0 < pAVar7->Amount) {
          uVar5 = 0;
        }
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar6,-42.0,-17.0,0x400013a6,0,0x4000139e,1,0x400013aa,uVar5,0
                  );
      }
      else {
        (pAVar3->InvSel).field_0.p = (AInventory *)0x0;
      }
    }
  }
  else {
    pAVar7 = DBaseStatusBar::ValidateInvFirst(&this->super_DBaseStatusBar,6);
    (((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst).field_0.p = pAVar7;
    pAVar3 = ((this->super_DBaseStatusBar).CPlayer)->mo;
    pAVar7 = (pAVar3->InvFirst).field_0.p;
    if (pAVar7 != (AInventory *)0x0) {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        iVar12 = 0;
        uVar13 = 0;
        do {
          pAVar3 = ((this->super_DBaseStatusBar).CPlayer)->mo;
          pAVar9 = (pAVar3->InvSel).field_0.p;
          if (pAVar9 == (AInventory *)0x0) {
LAB_004b07f9:
            pAVar9 = (AInventory *)0x0;
          }
          else if (((pAVar9->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
            (pAVar3->InvSel).field_0.p = (AInventory *)0x0;
            goto LAB_004b07f9;
          }
          pDVar4 = screen;
          if (pAVar7 == pAVar9) {
            pFVar6 = FImageCollection::operator[](this_00,this->CursorImage);
            DCanvas::DrawTexture
                      ((DCanvas *)pDVar4,pFVar6,(double)(iVar12 + -100),-21.0,0x400013a6,1,
                       0x4000138b,0xc000,0);
          }
          uVar1 = (pAVar7->Icon).texnum;
          iVar10 = iVar12;
          if (0 < (long)(int)uVar1) {
            if (uVar1 < TexMan.Textures.Count) {
              pFVar6 = TexMan.Textures.Array[TexMan.Translation.Array[(int)uVar1]].Texture;
            }
            else {
              pFVar6 = (FTexture *)0x0;
            }
            iVar10 = uVar13 * 0x23;
            uVar11 = 0xaa000000;
            if (0 < ((((this->super_DBaseStatusBar).CPlayer)->mo->InvSel).field_0.p)->Amount) {
              uVar11 = 0;
            }
            DCanvas::DrawTexture
                      ((DCanvas *)screen,pFVar6,(double)(iVar12 + -0x5e),-19.0,0x400013a6,1,
                       0x400013aa,uVar11,0);
          }
          DBaseStatusBar::DrINumberOuter
                    (&this->super_DBaseStatusBar,pAVar7->Amount,iVar10 + -0x59,-10,true,7);
          pAVar7 = AInventory::NextInv(pAVar7);
          if (pAVar7 == (AInventory *)0x0) {
            return;
          }
          iVar12 = iVar12 + 0x23;
          bVar14 = uVar13 < 5;
          uVar13 = uVar13 + 1;
        } while (bVar14);
      }
      else {
        (pAVar3->InvFirst).field_0.p = (AInventory *)0x0;
      }
    }
  }
  return;
}

Assistant:

void DrawFullScreenStuff ()
	{
		// Draw health
		DrINumberOuter (CPlayer->health, 4, -10, false, 7);
		screen->DrawTexture (Images[imgMEDI], 14, -17,
			DTA_HUDRules, HUD_Normal,
			DTA_CenterBottomOffset, true,
			TAG_DONE);

		// Draw armor
		ABasicArmor *armor = CPlayer->mo->FindInventory<ABasicArmor>();
		if (armor != NULL && armor->Amount != 0)
		{
			DrINumberOuter (armor->Amount, 35, -10, false, 7);
			screen->DrawTexture (TexMan(armor->Icon), 45, -17,
				DTA_HUDRules, HUD_Normal,
				DTA_CenterBottomOffset, true,
				TAG_DONE);
		}

		// Draw ammo
		AAmmo *ammo1, *ammo2;
		int ammocount1, ammocount2;

		GetCurrentAmmo (ammo1, ammo2, ammocount1, ammocount2);
		if (ammo1 != NULL)
		{
			// Draw primary ammo in the bottom-right corner
			DrINumberOuter (ammo1->Amount, -23, -10, false, 7);
			screen->DrawTexture (TexMan(ammo1->Icon), -14, -17,
				DTA_HUDRules, HUD_Normal,
				DTA_CenterBottomOffset, true,
				TAG_DONE);
			if (ammo2 != NULL && ammo1!=ammo2)
			{
				// Draw secondary ammo just above the primary ammo
				DrINumberOuter (ammo2->Amount, -23, -48, false, 7);
				screen->DrawTexture (TexMan(ammo2->Icon), -14, -55,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					TAG_DONE);
			}
		}

		if (deathmatch)
		{ // Draw frags (in DM)
			DrBNumberOuterFont (CPlayer->fragcount, -44, 1);
		}

		// Draw inventory
		if (CPlayer->inventorytics == 0)
		{
			if (CPlayer->mo->InvSel != 0)
			{
				if (ItemFlash > 0)
				{
					FTexture *cursor = Images[CursorImage];
					screen->DrawTexture (cursor, -28, -15,
						DTA_HUDRules, HUD_Normal,
						DTA_LeftOffset, cursor->GetWidth(),
						DTA_TopOffset, cursor->GetHeight(),
						DTA_AlphaF, ItemFlash,
						TAG_DONE);
				}
				DrINumberOuter (CPlayer->mo->InvSel->Amount, -51, -10, false, 7);
				screen->DrawTexture (TexMan(CPlayer->mo->InvSel->Icon), -42, -17,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					DTA_ColorOverlay, CPlayer->mo->InvSel->Amount > 0 ? 0 : DIM_OVERLAY,
					TAG_DONE);
			}
		}
		else
		{
			CPlayer->mo->InvFirst = ValidateInvFirst (6);
			int i = 0;
			AInventory *item;
			if (CPlayer->mo->InvFirst != NULL)
			{
				for (item = CPlayer->mo->InvFirst; item != NULL && i < 6; item = item->NextInv(), ++i)
				{
					if (item == CPlayer->mo->InvSel)
					{
						screen->DrawTexture (Images[CursorImage], -100+i*35, -21,
							DTA_HUDRules, HUD_HorizCenter,
							DTA_Alpha, TRANSLUC75,
							TAG_DONE);
					}
					if (item->Icon.isValid())
					{
						screen->DrawTexture (TexMan(item->Icon), -94 + i*35, -19,
							DTA_HUDRules, HUD_HorizCenter,
							DTA_ColorOverlay, CPlayer->mo->InvSel->Amount > 0 ? 0 : DIM_OVERLAY,
							TAG_DONE);
					}
					DrINumberOuter (item->Amount, -89 + i*35, -10, true, 7);
				}
			}
		}
	}